

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Serializer.cpp
# Opt level: O2

void __thiscall
adios2::format::BP4Serializer::PutProcessGroupIndex
          (BP4Serializer *this,string *ioName,string *hostLanguage,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *transportsTypes)

{
  long *plVar1;
  _func_int *p_Var2;
  const_iterator __position;
  _func_int *p_Var3;
  long lVar4;
  _func_int **pp_Var5;
  bool bVar6;
  byte bVar7;
  long lVar8;
  vector<char,_std::allocator<char>_> *buffer;
  vector<char,_std::allocator<char>_> *this_00;
  code *position;
  allocator local_17a;
  char columnMajor;
  BPSerializer *local_178;
  string *local_170;
  long local_168;
  long local_160;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_158;
  uint32_t processID;
  string timeStepName;
  string local_128;
  string local_108;
  vector<unsigned_char,_std::allocator<unsigned_char>_> methodIDs;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  p_Var2 = (this->super_BP4Base)._vptr_BP4Base[-3];
  local_170 = ioName;
  local_158 = transportsTypes;
  std::__cxx11::string::string((string *)&local_50,"buffering",(allocator *)&timeStepName);
  profiling::IOChrono::Start
            ((IOChrono *)(&(this->super_BP4Base).field_0x278 + (long)p_Var2),&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  p_Var2 = (this->super_BP4Base)._vptr_BP4Base[-3];
  this_00 = (vector<char,_std::allocator<char>_> *)
            (&(this->super_BP4Base).field_0xe8 + (long)p_Var2);
  local_160 = *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer);
  *(undefined4 *)
   (*(long *)(p_Var2 + 0x30 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) + local_160
   ) = 0x4947505b;
  lVar8 = *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer);
  *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) = lVar8 + 4;
  *(long *)(&(this->super_BP4Base).field_0x1a8 + (long)(this->super_BP4Base)._vptr_BP4Base[-3]) =
       lVar8 + 4;
  *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) =
       *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) + 8;
  __position._M_current = *(char **)(&(this->super_BP4Base).field_0xf0 + (long)p_Var2);
  local_168 = (long)__position._M_current -
              (long)(this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_start;
  timeStepName._M_dataplus._M_p._0_1_ = 0;
  std::vector<char,_std::allocator<char>_>::insert(this_00,__position,2,(value_type *)&timeStepName)
  ;
  std::__cxx11::string::string((string *)&local_70,(string *)local_170);
  local_178 = (BPSerializer *)&(this->super_BP4Base).field_0xa0;
  BPSerializer::PutNameRecord(local_178,&local_70,this_00);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_108,(string *)hostLanguage);
  buffer = (vector<char,_std::allocator<char>_> *)
           (p_Var2 + 0x30 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer);
  position = p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer;
  bVar6 = helper::IsRowMajor(&local_108);
  columnMajor = 'y';
  if (bVar6) {
    columnMajor = 'n';
  }
  std::__cxx11::string::~string((string *)&local_108);
  helper::InsertToBuffer<char>(this_00,&columnMajor,1);
  (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
  [*(long *)position] = columnMajor;
  *(long *)position = *(long *)position + 1;
  std::__cxx11::string::string((string *)&local_90,(string *)local_170);
  BPSerializer::PutNameRecord(local_178,&local_90,buffer,(size_t *)position);
  std::__cxx11::string::~string((string *)&local_90);
  processID = *(uint32_t *)
               ((this->super_BP4Base)._vptr_BP4Base[-3] + 8 +
               (long)&(this->super_BP4Base).m_MetadataIndexTable._M_h);
  helper::InsertToBuffer<unsigned_int>(this_00,&processID,1);
  *(long *)position = *(long *)position + 4;
  std::__cxx11::to_string
            (&timeStepName,
             *(uint *)(&(this->super_BP4Base).field_0xe0 +
                      (long)(this->super_BP4Base)._vptr_BP4Base[-3]));
  std::__cxx11::string::string((string *)&local_b0,(string *)&timeStepName);
  BPSerializer::PutNameRecord(local_178,&local_b0,this_00);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_d0,(string *)&timeStepName);
  BPSerializer::PutNameRecord(local_178,&local_d0,buffer,(size_t *)position);
  std::__cxx11::string::~string((string *)&local_d0);
  helper::InsertToBuffer<unsigned_int>
            (this_00,(uint *)(&(this->super_BP4Base).field_0xe0 +
                             (long)(this->super_BP4Base)._vptr_BP4Base[-3]),1);
  *(undefined4 *)
   (*(long *)(p_Var2 + 0x30 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) +
   *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer)) =
       *(undefined4 *)
        (&(this->super_BP4Base).field_0xe0 + (long)(this->super_BP4Base)._vptr_BP4Base[-3]);
  *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) =
       *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) + 4;
  p_Var3 = (this->super_BP4Base)._vptr_BP4Base[-3];
  helper::InsertU64<unsigned_long>
            (this_00,*(long *)(p_Var3 + 0x20 +
                              (long)&(this->super_BP4Base).m_MetadataIndexTable._M_h) +
                     *(long *)(p_Var3 + 0x28 +
                              (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer));
  lVar8 = *(long *)(&(this->super_BP4Base).field_0xe8 + (long)p_Var2);
  *(short *)(local_168 + lVar8) =
       ((short)*(undefined4 *)(&(this->super_BP4Base).field_0xf0 + (long)p_Var2) -
       ((short)local_168 + (short)lVar8)) + -2;
  BPBase::GetTransportIDs
            (&methodIDs,
             (BPBase *)
             ((long)&(this->super_BP4Base)._vptr_BP4Base +
             (long)(this->super_BP4Base)._vptr_BP4Base[-3]),local_158);
  bVar7 = (char)methodIDs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (char)methodIDs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  *(byte *)(*(long *)(p_Var2 + 0x30 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) +
           *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer)) =
       bVar7;
  lVar8 = *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer);
  lVar4 = *(long *)(p_Var2 + 0x30 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer);
  *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) = lVar8 + 1;
  *(ushort *)(lVar4 + 1 + lVar8) = (ushort)bVar7 + (ushort)bVar7 * 2;
  lVar8 = *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) + 2;
  *(long *)(p_Var2 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) = lVar8;
  for (; methodIDs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start !=
         methodIDs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
      methodIDs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           methodIDs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + 1) {
    (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
    _M_start[lVar8] =
         *methodIDs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
    lVar8 = *(long *)position + 3;
    *(long *)position = lVar8;
  }
  pp_Var5 = (this->super_BP4Base)._vptr_BP4Base;
  *(long *)(pp_Var5[-3] + 0x28 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) =
       *(long *)(pp_Var5[-3] + 0x28 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) +
       (lVar8 - local_160);
  *(undefined4 *)(&(this->super_BP4Base).field_0x1b0 + (long)pp_Var5[-3]) = 0;
  lVar8 = *(long *)position;
  *(long *)(&(this->super_BP4Base).field_0x1b8 + (long)pp_Var5[-3]) = lVar8;
  *(long *)position = lVar8 + 0xc;
  *(long *)(pp_Var5[-3] + 0x28 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) =
       *(long *)(pp_Var5[-3] + 0x28 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) +
       0xc;
  plVar1 = (long *)(&(this->super_BP4Base).field_0x1a0 + (long)pp_Var5[-3]);
  *plVar1 = *plVar1 + 1;
  (&(this->super_BP4Base).field_0x1c0)[(long)pp_Var5[-3]] = 1;
  p_Var2 = pp_Var5[-3];
  std::__cxx11::string::string((string *)&local_128,"buffering",&local_17a);
  profiling::IOChrono::Stop
            ((IOChrono *)(&(this->super_BP4Base).field_0x278 + (long)p_Var2),&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&methodIDs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::__cxx11::string::~string((string *)&timeStepName);
  return;
}

Assistant:

void BP4Serializer::PutProcessGroupIndex(const std::string &ioName, const std::string hostLanguage,
                                         const std::vector<std::string> &transportsTypes) noexcept
{
    m_Profiler.Start("buffering");
    std::vector<char> &metadataBuffer = m_MetadataSet.PGIndex.Buffer;

    std::vector<char> &dataBuffer = m_Data.m_Buffer;
    size_t &dataPosition = m_Data.m_Position;
    const size_t pgBeginPosition = dataPosition;

    // write a block identifier [PGI
    const char pgi[] = "[PGI"; //  don't write \0!
    helper::CopyToBuffer(dataBuffer, dataPosition, pgi, sizeof(pgi) - 1);

    m_MetadataSet.DataPGLengthPosition = dataPosition;
    dataPosition += 8; // skip pg length (8)

    const std::size_t metadataPGLengthPosition = metadataBuffer.size();
    metadataBuffer.insert(metadataBuffer.end(), 2, '\0'); // skip pg length (2)

    // write name to metadata
    PutNameRecord(ioName, metadataBuffer);

    // write if data is column major in metadata and data
    const char columnMajor = (helper::IsRowMajor(hostLanguage) == false) ? 'y' : 'n';
    helper::InsertToBuffer(metadataBuffer, &columnMajor);
    helper::CopyToBuffer(dataBuffer, dataPosition, &columnMajor);

    // write name in data
    PutNameRecord(ioName, dataBuffer, dataPosition);

    // processID in metadata,
    const uint32_t processID = static_cast<uint32_t>(m_RankMPI);
    helper::InsertToBuffer(metadataBuffer, &processID);
    // skip coordination var in data ....what is coordination var?
    dataPosition += 4;

    // time step name to metadata and data
    const std::string timeStepName(std::to_string(m_MetadataSet.TimeStep));
    PutNameRecord(timeStepName, metadataBuffer);
    PutNameRecord(timeStepName, dataBuffer, dataPosition);

    // time step to metadata and data
    helper::InsertToBuffer(metadataBuffer, &m_MetadataSet.TimeStep);
    helper::CopyToBuffer(dataBuffer, dataPosition, &m_MetadataSet.TimeStep);

    // offset to pg in data in metadata which is the current absolute position
    helper::InsertU64(metadataBuffer, m_Data.m_AbsolutePosition + m_PreDataFileLength);

    // Back to writing metadata pg index length (length of group)
    const uint16_t metadataPGIndexLength =
        static_cast<uint16_t>(metadataBuffer.size() - metadataPGLengthPosition - 2);

    size_t backPosition = metadataPGLengthPosition;
    helper::CopyToBuffer(metadataBuffer, backPosition, &metadataPGIndexLength);
    // DONE With metadataBuffer

    // here write method in data
    const std::vector<uint8_t> methodIDs = GetTransportIDs(transportsTypes);
    const uint8_t methodsCount = static_cast<uint8_t>(methodIDs.size());
    helper::CopyToBuffer(dataBuffer, dataPosition, &methodsCount); // count
    // methodID (1) + method params length(2), no parameters for now
    const uint16_t methodsLength = static_cast<uint16_t>(methodsCount * 3);

    helper::CopyToBuffer(dataBuffer, dataPosition, &methodsLength); // length

    for (const auto methodID : methodIDs)
    {
        helper::CopyToBuffer(dataBuffer, dataPosition, &methodID); // method ID,
        dataPosition += 2; // skip method params length = 0 (2 bytes) for now
    }

    // update absolute position
    m_Data.m_AbsolutePosition += dataPosition - pgBeginPosition;
    // pg vars count and position
    m_MetadataSet.DataPGVarsCount = 0;
    m_MetadataSet.DataPGVarsCountPosition = dataPosition;
    // add vars count and length
    dataPosition += 12;
    m_Data.m_AbsolutePosition += 12; // add vars count and length

    ++m_MetadataSet.DataPGCount;
    m_MetadataSet.DataPGIsOpen = true;

    m_Profiler.Stop("buffering");
}